

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOPinData.cpp
# Opt level: O2

vector<GPIO::PinDefinition,_std::allocator<GPIO::PinDefinition>_> *
GPIO::EntirePinData::_JETSON_NANO_PIN_DEFS(void)

{
  long lVar1;
  vector<GPIO::PinDefinition,_std::allocator<GPIO::PinDefinition>_> *in_RDI;
  initializer_list<GPIO::PinDefinition> __l;
  allocator_type local_2679;
  allocator local_2678;
  allocator local_2677;
  allocator local_2676;
  allocator local_2675;
  allocator local_2674;
  allocator local_2673;
  allocator local_2672;
  allocator local_2671;
  allocator local_2670;
  allocator local_266f;
  allocator local_266e;
  allocator local_266d;
  allocator local_266c;
  allocator local_266b;
  allocator local_266a;
  allocator local_2669;
  allocator local_2668;
  allocator local_2667;
  allocator local_2666;
  allocator local_2665;
  allocator local_2664;
  allocator local_2663;
  allocator local_2662;
  allocator local_2661;
  allocator local_2660;
  allocator local_265f;
  allocator local_265e;
  allocator local_265d;
  allocator local_265c;
  allocator local_265b;
  allocator local_265a;
  allocator local_2659;
  allocator local_2658;
  allocator local_2657;
  allocator local_2656;
  allocator local_2655;
  allocator local_2654;
  allocator local_2653;
  allocator local_2652;
  allocator local_2651;
  allocator local_2650;
  allocator local_264f;
  allocator local_264e;
  allocator local_264d;
  allocator local_264c;
  allocator local_264b;
  allocator local_264a;
  allocator local_2649;
  allocator local_2648;
  allocator local_2647;
  allocator local_2646;
  allocator local_2645;
  allocator local_2644;
  allocator local_2643;
  allocator local_2642;
  allocator local_2641;
  allocator local_2640;
  allocator local_263f;
  allocator local_263e;
  allocator local_263d;
  allocator local_263c;
  allocator local_263b;
  allocator local_263a;
  allocator local_2639;
  allocator local_2638;
  allocator local_2637;
  allocator local_2636;
  allocator local_2635;
  allocator local_2634;
  allocator local_2633;
  allocator local_2632;
  allocator local_2631;
  allocator local_2630;
  allocator local_262f;
  allocator local_262e;
  allocator local_262d;
  allocator local_262c;
  allocator local_262b;
  allocator local_262a;
  allocator local_2629;
  allocator local_2628;
  allocator local_2627;
  allocator local_2626;
  allocator local_2625;
  allocator local_2624;
  allocator local_2623;
  allocator local_2622;
  allocator local_2621;
  allocator local_2620;
  allocator local_261f;
  allocator local_261e;
  allocator local_261d;
  allocator local_261c;
  allocator local_261b;
  allocator local_261a;
  allocator local_2619;
  allocator local_2618;
  allocator local_2617;
  allocator local_2616;
  allocator local_2615;
  allocator local_2614;
  allocator local_2613;
  allocator local_2612;
  allocator local_2611;
  allocator local_2610;
  allocator local_260f;
  allocator local_260e;
  allocator local_260d;
  allocator local_260c;
  allocator local_260b;
  allocator local_260a;
  allocator local_2609;
  DictionaryLike *local_2608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20a0;
  undefined1 local_2080 [208];
  string local_1fb0 [32];
  string local_1f90 [32];
  string local_1f70 [32];
  string local_1f50 [32];
  string local_1f30;
  int local_1f10;
  DictionaryLike local_1f08;
  DictionaryLike local_1eb0;
  string local_1e58 [32];
  string local_1e38 [32];
  string local_1e18 [32];
  string local_1df8 [32];
  string local_1dd8 [32];
  string local_1db8;
  undefined4 local_1d98;
  DictionaryLike local_1d90;
  DictionaryLike local_1d38;
  string local_1ce0 [32];
  string local_1cc0 [32];
  string local_1ca0 [32];
  string local_1c80 [32];
  string local_1c60 [32];
  string local_1c40;
  undefined4 local_1c20;
  DictionaryLike local_1c18;
  DictionaryLike local_1bc0;
  string local_1b68 [32];
  string local_1b48 [32];
  string local_1b28 [32];
  string local_1b08 [32];
  string local_1ae8 [32];
  string local_1ac8;
  undefined4 local_1aa8;
  DictionaryLike local_1aa0;
  DictionaryLike local_1a48;
  string local_19f0 [32];
  string local_19d0 [32];
  string local_19b0 [32];
  string local_1990 [32];
  string local_1970 [32];
  string local_1950;
  undefined4 local_1930;
  DictionaryLike local_1928;
  DictionaryLike local_18d0;
  string local_1878 [32];
  string local_1858 [32];
  string local_1838 [32];
  string local_1818 [32];
  string local_17f8 [32];
  string local_17d8;
  undefined4 local_17b8;
  DictionaryLike local_17b0;
  DictionaryLike local_1758;
  string local_1700 [32];
  string local_16e0 [32];
  string local_16c0 [32];
  string local_16a0 [32];
  string local_1680 [32];
  string local_1660;
  undefined4 local_1640;
  DictionaryLike local_1638;
  DictionaryLike local_15e0;
  string local_1588 [32];
  string local_1568 [32];
  string local_1548 [32];
  string local_1528 [32];
  string local_1508 [32];
  string local_14e8;
  undefined4 local_14c8;
  DictionaryLike local_14c0;
  DictionaryLike local_1468;
  string local_1410 [32];
  string local_13f0 [32];
  string local_13d0 [32];
  string local_13b0 [32];
  string local_1390 [32];
  string local_1370;
  undefined4 local_1350;
  DictionaryLike local_1348;
  DictionaryLike local_12f0;
  string local_1298 [32];
  string local_1278 [32];
  string local_1258 [32];
  string local_1238 [32];
  string local_1218 [32];
  string local_11f8;
  undefined4 local_11d8;
  DictionaryLike local_11d0;
  DictionaryLike local_1178;
  string local_1120 [32];
  string local_1100 [32];
  string local_10e0 [32];
  string local_10c0 [32];
  string local_10a0 [32];
  string local_1080;
  undefined4 local_1060;
  DictionaryLike local_1058;
  DictionaryLike local_1000;
  string local_fa8 [32];
  string local_f88 [32];
  string local_f68 [32];
  string local_f48 [32];
  string local_f28 [32];
  string local_f08;
  undefined4 local_ee8;
  DictionaryLike local_ee0;
  DictionaryLike local_e88;
  string local_e30 [32];
  string local_e10 [32];
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90;
  undefined4 local_d70;
  DictionaryLike local_d68;
  DictionaryLike local_d10;
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18;
  undefined4 local_bf8;
  DictionaryLike local_bf0;
  DictionaryLike local_b98;
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0;
  undefined4 local_a80;
  DictionaryLike local_a78;
  DictionaryLike local_a20;
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [32];
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  undefined4 local_908;
  DictionaryLike local_900;
  DictionaryLike local_8a8;
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  undefined4 local_790;
  DictionaryLike local_788;
  DictionaryLike local_730;
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638;
  undefined4 local_618;
  DictionaryLike local_610;
  DictionaryLike local_5b8;
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0;
  undefined4 local_4a0;
  DictionaryLike local_498;
  DictionaryLike local_440;
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348;
  undefined4 local_328;
  DictionaryLike local_320;
  DictionaryLike local_2c8;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0;
  undefined4 local_1b0;
  DictionaryLike local_1a8;
  DictionaryLike local_150;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58;
  undefined4 local_38;
  
  s_abi_cxx11_(&local_20a0,"216",3);
  DictionaryLike::DictionaryLike((DictionaryLike *)local_2080,&local_20a0);
  s_abi_cxx11_(&local_20c0,"{}",2);
  DictionaryLike::DictionaryLike((DictionaryLike *)(local_2080 + 0x58),&local_20c0);
  std::__cxx11::string::string((string *)(local_2080 + 0xb0),"6000d000.gpio",&local_2609);
  std::__cxx11::string::string(local_1fb0,"7",&local_260a);
  std::__cxx11::string::string(local_1f90,"4",&local_260b);
  std::__cxx11::string::string(local_1f70,"GPIO9",&local_260c);
  std::__cxx11::string::string(local_1f50,"AUD_MCLK",&local_260d);
  NoneType::operator_cast_to_string(&local_1f30,(NoneType *)&None);
  local_1f10 = -1;
  s_abi_cxx11_(&local_20e0,"50",2);
  DictionaryLike::DictionaryLike(&local_1f08,&local_20e0);
  s_abi_cxx11_(&local_2100,"{}",2);
  DictionaryLike::DictionaryLike(&local_1eb0,&local_2100);
  std::__cxx11::string::string(local_1e58,"6000d000.gpio",&local_260e);
  std::__cxx11::string::string(local_1e38,"11",&local_260f);
  std::__cxx11::string::string(local_1e18,"17",&local_2610);
  std::__cxx11::string::string(local_1df8,"UART1_RTS",&local_2611);
  std::__cxx11::string::string(local_1dd8,"UART2_RTS",&local_2612);
  NoneType::operator_cast_to_string(&local_1db8,(NoneType *)&None);
  local_1d98 = 0xffffffff;
  s_abi_cxx11_(&local_2120,"79",2);
  DictionaryLike::DictionaryLike(&local_1d90,&local_2120);
  s_abi_cxx11_(&local_2140,"{}",2);
  DictionaryLike::DictionaryLike(&local_1d38,&local_2140);
  std::__cxx11::string::string(local_1ce0,"6000d000.gpio",&local_2613);
  std::__cxx11::string::string(local_1cc0,"12",&local_2614);
  std::__cxx11::string::string(local_1ca0,"18",&local_2615);
  std::__cxx11::string::string(local_1c80,"I2S0_SCLK",&local_2616);
  std::__cxx11::string::string(local_1c60,"DAP4_SCLK",&local_2617);
  NoneType::operator_cast_to_string(&local_1c40,(NoneType *)&None);
  local_1c20 = 0xffffffff;
  s_abi_cxx11_(&local_2160,"14",2);
  DictionaryLike::DictionaryLike(&local_1c18,&local_2160);
  s_abi_cxx11_(&local_2180,"{}",2);
  DictionaryLike::DictionaryLike(&local_1bc0,&local_2180);
  std::__cxx11::string::string(local_1b68,"6000d000.gpio",&local_2618);
  std::__cxx11::string::string(local_1b48,"13",&local_2619);
  std::__cxx11::string::string(local_1b28,"27",&local_261a);
  std::__cxx11::string::string(local_1b08,"SPI1_SCK",&local_261b);
  std::__cxx11::string::string(local_1ae8,"SPI2_SCK",&local_261c);
  NoneType::operator_cast_to_string(&local_1ac8,(NoneType *)&None);
  local_1aa8 = 0xffffffff;
  s_abi_cxx11_(&local_21a0,"194",3);
  DictionaryLike::DictionaryLike(&local_1aa0,&local_21a0);
  s_abi_cxx11_(&local_21c0,"{}",2);
  DictionaryLike::DictionaryLike(&local_1a48,&local_21c0);
  std::__cxx11::string::string(local_19f0,"6000d000.gpio",&local_261d);
  std::__cxx11::string::string(local_19d0,"15",&local_261e);
  std::__cxx11::string::string(local_19b0,"22",&local_261f);
  std::__cxx11::string::string(local_1990,"GPIO12",&local_2620);
  std::__cxx11::string::string(local_1970,"LCD_TE",&local_2621);
  NoneType::operator_cast_to_string(&local_1950,(NoneType *)&None);
  local_1930 = 0xffffffff;
  s_abi_cxx11_(&local_21e0,"232",3);
  DictionaryLike::DictionaryLike(&local_1928,&local_21e0);
  s_abi_cxx11_(&local_2200,"{}",2);
  DictionaryLike::DictionaryLike(&local_18d0,&local_2200);
  std::__cxx11::string::string(local_1878,"6000d000.gpio",&local_2622);
  std::__cxx11::string::string(local_1858,"16",&local_2623);
  std::__cxx11::string::string(local_1838,"23",&local_2624);
  std::__cxx11::string::string(local_1818,"SPI1_CS1",&local_2625);
  std::__cxx11::string::string(local_17f8,"SPI2_CS1",&local_2626);
  NoneType::operator_cast_to_string(&local_17d8,(NoneType *)&None);
  local_17b8 = 0xffffffff;
  s_abi_cxx11_(&local_2220,"15",2);
  DictionaryLike::DictionaryLike(&local_17b0,&local_2220);
  s_abi_cxx11_(&local_2240,"{}",2);
  DictionaryLike::DictionaryLike(&local_1758,&local_2240);
  std::__cxx11::string::string(local_1700,"6000d000.gpio",&local_2627);
  std::__cxx11::string::string(local_16e0,"18",&local_2628);
  std::__cxx11::string::string(local_16c0,"24",&local_2629);
  std::__cxx11::string::string(local_16a0,"SPI1_CS0",&local_262a);
  std::__cxx11::string::string(local_1680,"SPI2_CS0",&local_262b);
  NoneType::operator_cast_to_string(&local_1660,(NoneType *)&None);
  local_1640 = 0xffffffff;
  s_abi_cxx11_(&local_2260,"16",2);
  DictionaryLike::DictionaryLike(&local_1638,&local_2260);
  s_abi_cxx11_(&local_2280,"{}",2);
  DictionaryLike::DictionaryLike(&local_15e0,&local_2280);
  std::__cxx11::string::string(local_1588,"6000d000.gpio",&local_262c);
  std::__cxx11::string::string(local_1568,"19",&local_262d);
  std::__cxx11::string::string(local_1548,"10",&local_262e);
  std::__cxx11::string::string(local_1528,"SPI0_MOSI",&local_262f);
  std::__cxx11::string::string(local_1508,"SPI1_MOSI",&local_2630);
  NoneType::operator_cast_to_string(&local_14e8,(NoneType *)&None);
  local_14c8 = 0xffffffff;
  s_abi_cxx11_(&local_22a0,"17",2);
  DictionaryLike::DictionaryLike(&local_14c0,&local_22a0);
  s_abi_cxx11_(&local_22c0,"{}",2);
  DictionaryLike::DictionaryLike(&local_1468,&local_22c0);
  std::__cxx11::string::string(local_1410,"6000d000.gpio",&local_2631);
  std::__cxx11::string::string(local_13f0,"21",&local_2632);
  std::__cxx11::string::string(local_13d0,"9",&local_2633);
  std::__cxx11::string::string(local_13b0,"SPI0_MISO",&local_2634);
  std::__cxx11::string::string(local_1390,"SPI1_MISO",&local_2635);
  NoneType::operator_cast_to_string(&local_1370,(NoneType *)&None);
  local_1350 = 0xffffffff;
  s_abi_cxx11_(&local_22e0,"13",2);
  DictionaryLike::DictionaryLike(&local_1348,&local_22e0);
  s_abi_cxx11_(&local_2300,"{}",2);
  DictionaryLike::DictionaryLike(&local_12f0,&local_2300);
  std::__cxx11::string::string(local_1298,"6000d000.gpio",&local_2636);
  std::__cxx11::string::string(local_1278,"22",&local_2637);
  std::__cxx11::string::string(local_1258,"25",&local_2638);
  std::__cxx11::string::string(local_1238,"SPI1_MISO",&local_2639);
  std::__cxx11::string::string(local_1218,"SPI2_MISO",&local_263a);
  NoneType::operator_cast_to_string(&local_11f8,(NoneType *)&None);
  local_11d8 = 0xffffffff;
  s_abi_cxx11_(&local_2320,"18",2);
  DictionaryLike::DictionaryLike(&local_11d0,&local_2320);
  s_abi_cxx11_(&local_2340,"{}",2);
  DictionaryLike::DictionaryLike(&local_1178,&local_2340);
  std::__cxx11::string::string(local_1120,"6000d000.gpio",&local_263b);
  std::__cxx11::string::string(local_1100,"23",&local_263c);
  std::__cxx11::string::string(local_10e0,"11",&local_263d);
  std::__cxx11::string::string(local_10c0,"SPI0_SCK",&local_263e);
  std::__cxx11::string::string(local_10a0,"SPI1_SCK",&local_263f);
  NoneType::operator_cast_to_string(&local_1080,(NoneType *)&None);
  local_1060 = 0xffffffff;
  s_abi_cxx11_(&local_2360,"19",2);
  DictionaryLike::DictionaryLike(&local_1058,&local_2360);
  s_abi_cxx11_(&local_2380,"{}",2);
  DictionaryLike::DictionaryLike(&local_1000,&local_2380);
  std::__cxx11::string::string(local_fa8,"6000d000.gpio",&local_2640);
  std::__cxx11::string::string(local_f88,"24",&local_2641);
  std::__cxx11::string::string(local_f68,"8",&local_2642);
  std::__cxx11::string::string(local_f48,"SPI0_CS0",&local_2643);
  std::__cxx11::string::string(local_f28,"SPI1_CS0",&local_2644);
  NoneType::operator_cast_to_string(&local_f08,(NoneType *)&None);
  local_ee8 = 0xffffffff;
  s_abi_cxx11_(&local_23a0,"20",2);
  DictionaryLike::DictionaryLike(&local_ee0,&local_23a0);
  s_abi_cxx11_(&local_23c0,"{}",2);
  DictionaryLike::DictionaryLike(&local_e88,&local_23c0);
  std::__cxx11::string::string(local_e30,"6000d000.gpio",&local_2645);
  std::__cxx11::string::string(local_e10,"26",&local_2646);
  std::__cxx11::string::string(local_df0,"7",&local_2647);
  std::__cxx11::string::string(local_dd0,"SPI0_CS1",&local_2648);
  std::__cxx11::string::string(local_db0,"SPI1_CS1",&local_2649);
  NoneType::operator_cast_to_string(&local_d90,(NoneType *)&None);
  local_d70 = 0xffffffff;
  s_abi_cxx11_(&local_23e0,"149",3);
  DictionaryLike::DictionaryLike(&local_d68,&local_23e0);
  s_abi_cxx11_(&local_2400,"{}",2);
  DictionaryLike::DictionaryLike(&local_d10,&local_2400);
  std::__cxx11::string::string(local_cb8,"6000d000.gpio",&local_264a);
  std::__cxx11::string::string(local_c98,"29",&local_264b);
  std::__cxx11::string::string(local_c78,"5",&local_264c);
  std::__cxx11::string::string(local_c58,"GPIO01",&local_264d);
  std::__cxx11::string::string(local_c38,"CAM_AF_EN",&local_264e);
  NoneType::operator_cast_to_string(&local_c18,(NoneType *)&None);
  local_bf8 = 0xffffffff;
  s_abi_cxx11_(&local_2420,"200",3);
  DictionaryLike::DictionaryLike(&local_bf0,&local_2420);
  s_abi_cxx11_(&local_2440,"{}",2);
  DictionaryLike::DictionaryLike(&local_b98,&local_2440);
  std::__cxx11::string::string(local_b40,"6000d000.gpio",&local_264f);
  std::__cxx11::string::string(local_b20,"31",&local_2650);
  std::__cxx11::string::string(local_b00,"6",&local_2651);
  std::__cxx11::string::string(local_ae0,"GPIO11",&local_2652);
  std::__cxx11::string::string(local_ac0,"GPIO_PZ0",&local_2653);
  NoneType::operator_cast_to_string(&local_aa0,(NoneType *)&None);
  local_a80 = 0xffffffff;
  s_abi_cxx11_(&local_2460,"168",3);
  DictionaryLike::DictionaryLike(&local_a78,&local_2460);
  s_abi_cxx11_(&local_2480,"{}",2);
  DictionaryLike::DictionaryLike(&local_a20,&local_2480);
  std::__cxx11::string::string(local_9c8,"6000d000.gpio",&local_2654);
  std::__cxx11::string::string(local_9a8,"32",&local_2655);
  std::__cxx11::string::string(local_988,"12",&local_2656);
  std::__cxx11::string::string(local_968,"GPIO07",&local_2657);
  std::__cxx11::string::string(local_948,"LCD_BL_PW",&local_2658);
  std::__cxx11::string::string(local_928,"7000a000.pwm",&local_2659);
  local_908 = 0;
  s_abi_cxx11_(&local_24a0,"38",2);
  DictionaryLike::DictionaryLike(&local_900,&local_24a0);
  s_abi_cxx11_(&local_24c0,"{}",2);
  DictionaryLike::DictionaryLike(&local_8a8,&local_24c0);
  std::__cxx11::string::string(local_850,"6000d000.gpio",&local_265a);
  std::__cxx11::string::string(local_830,"33",&local_265b);
  std::__cxx11::string::string(local_810,"13",&local_265c);
  std::__cxx11::string::string(local_7f0,"GPIO13",&local_265d);
  std::__cxx11::string::string(local_7d0,"GPIO_PE6",&local_265e);
  std::__cxx11::string::string(local_7b0,"7000a000.pwm",&local_265f);
  local_790 = 2;
  s_abi_cxx11_(&local_24e0,"76",2);
  DictionaryLike::DictionaryLike(&local_788,&local_24e0);
  s_abi_cxx11_(&local_2500,"{}",2);
  DictionaryLike::DictionaryLike(&local_730,&local_2500);
  std::__cxx11::string::string(local_6d8,"6000d000.gpio",&local_2660);
  std::__cxx11::string::string(local_6b8,"35",&local_2661);
  std::__cxx11::string::string(local_698,"19",&local_2662);
  std::__cxx11::string::string(local_678,"I2S0_FS",&local_2663);
  std::__cxx11::string::string(local_658,"DAP4_FS",&local_2664);
  NoneType::operator_cast_to_string(&local_638,(NoneType *)&None);
  local_618 = 0xffffffff;
  s_abi_cxx11_(&local_2520,"51",2);
  DictionaryLike::DictionaryLike(&local_610,&local_2520);
  s_abi_cxx11_(&local_2540,"{}",2);
  DictionaryLike::DictionaryLike(&local_5b8,&local_2540);
  std::__cxx11::string::string(local_560,"6000d000.gpio",&local_2665);
  std::__cxx11::string::string(local_540,"36",&local_2666);
  std::__cxx11::string::string(local_520,"16",&local_2667);
  std::__cxx11::string::string(local_500,"UART1_CTS",&local_2668);
  std::__cxx11::string::string(local_4e0,"UART2_CTS",&local_2669);
  NoneType::operator_cast_to_string(&local_4c0,(NoneType *)&None);
  local_4a0 = 0xffffffff;
  s_abi_cxx11_(&local_2560,"12",2);
  DictionaryLike::DictionaryLike(&local_498,&local_2560);
  s_abi_cxx11_(&local_2580,"{}",2);
  DictionaryLike::DictionaryLike(&local_440,&local_2580);
  std::__cxx11::string::string(local_3e8,"6000d000.gpio",&local_266a);
  std::__cxx11::string::string(local_3c8,"37",&local_266b);
  std::__cxx11::string::string(local_3a8,"26",&local_266c);
  std::__cxx11::string::string(local_388,"SPI1_MOSI",&local_266d);
  std::__cxx11::string::string(local_368,"SPI2_MOSI",&local_266e);
  NoneType::operator_cast_to_string(&local_348,(NoneType *)&None);
  local_328 = 0xffffffff;
  s_abi_cxx11_(&local_25a0,"77",2);
  DictionaryLike::DictionaryLike(&local_320,&local_25a0);
  s_abi_cxx11_(&local_25c0,"{}",2);
  DictionaryLike::DictionaryLike(&local_2c8,&local_25c0);
  std::__cxx11::string::string(local_270,"6000d000.gpio",&local_266f);
  std::__cxx11::string::string(local_250,"38",&local_2670);
  std::__cxx11::string::string(local_230,"20",&local_2671);
  std::__cxx11::string::string(local_210,"I2S0_DIN",&local_2672);
  std::__cxx11::string::string(local_1f0,"DAP4_DIN",&local_2673);
  NoneType::operator_cast_to_string(&local_1d0,(NoneType *)&None);
  local_1b0 = 0xffffffff;
  local_2608 = &local_1a8;
  s_abi_cxx11_(&local_25e0,"78",2);
  DictionaryLike::DictionaryLike(&local_1a8,&local_25e0);
  s_abi_cxx11_(&local_2600,"{}",2);
  DictionaryLike::DictionaryLike(&local_150,&local_2600);
  std::__cxx11::string::string(local_f8,"6000d000.gpio",&local_2674);
  std::__cxx11::string::string(local_d8,"40",&local_2675);
  std::__cxx11::string::string(local_b8,"21",&local_2676);
  std::__cxx11::string::string(local_98,"I2S0_DOUT",&local_2677);
  std::__cxx11::string::string(local_78,"DAP4_DOUT",&local_2678);
  NoneType::operator_cast_to_string(&local_58,(NoneType *)&None);
  local_38 = 0xffffffff;
  __l._M_len = 0x16;
  __l._M_array = (iterator)local_2080;
  std::vector<GPIO::PinDefinition,_std::allocator<GPIO::PinDefinition>_>::vector
            (in_RDI,__l,&local_2679);
  lVar1 = 0x1ed8;
  do {
    PinDefinition::~PinDefinition((PinDefinition *)(local_2080 + lVar1));
    lVar1 = lVar1 + -0x178;
  } while (lVar1 != -0x178);
  std::__cxx11::string::~string((string *)&local_2600);
  std::__cxx11::string::~string((string *)&local_25e0);
  std::__cxx11::string::~string((string *)&local_25c0);
  std::__cxx11::string::~string((string *)&local_25a0);
  std::__cxx11::string::~string((string *)&local_2580);
  std::__cxx11::string::~string((string *)&local_2560);
  std::__cxx11::string::~string((string *)&local_2540);
  std::__cxx11::string::~string((string *)&local_2520);
  std::__cxx11::string::~string((string *)&local_2500);
  std::__cxx11::string::~string((string *)&local_24e0);
  std::__cxx11::string::~string((string *)&local_24c0);
  std::__cxx11::string::~string((string *)&local_24a0);
  std::__cxx11::string::~string((string *)&local_2480);
  std::__cxx11::string::~string((string *)&local_2460);
  std::__cxx11::string::~string((string *)&local_2440);
  std::__cxx11::string::~string((string *)&local_2420);
  std::__cxx11::string::~string((string *)&local_2400);
  std::__cxx11::string::~string((string *)&local_23e0);
  std::__cxx11::string::~string((string *)&local_23c0);
  std::__cxx11::string::~string((string *)&local_23a0);
  std::__cxx11::string::~string((string *)&local_2380);
  std::__cxx11::string::~string((string *)&local_2360);
  std::__cxx11::string::~string((string *)&local_2340);
  std::__cxx11::string::~string((string *)&local_2320);
  std::__cxx11::string::~string((string *)&local_2300);
  std::__cxx11::string::~string((string *)&local_22e0);
  std::__cxx11::string::~string((string *)&local_22c0);
  std::__cxx11::string::~string((string *)&local_22a0);
  std::__cxx11::string::~string((string *)&local_2280);
  std::__cxx11::string::~string((string *)&local_2260);
  std::__cxx11::string::~string((string *)&local_2240);
  std::__cxx11::string::~string((string *)&local_2220);
  std::__cxx11::string::~string((string *)&local_2200);
  std::__cxx11::string::~string((string *)&local_21e0);
  std::__cxx11::string::~string((string *)&local_21c0);
  std::__cxx11::string::~string((string *)&local_21a0);
  std::__cxx11::string::~string((string *)&local_2180);
  std::__cxx11::string::~string((string *)&local_2160);
  std::__cxx11::string::~string((string *)&local_2140);
  std::__cxx11::string::~string((string *)&local_2120);
  std::__cxx11::string::~string((string *)&local_2100);
  std::__cxx11::string::~string((string *)&local_20e0);
  std::__cxx11::string::~string((string *)&local_20c0);
  std::__cxx11::string::~string((string *)&local_20a0);
  return in_RDI;
}

Assistant:

static vector<PinDefinition> _JETSON_NANO_PIN_DEFS()
        {
            return {
                { "216"s, "{}"s, "6000d000.gpio", "7", "4",   "GPIO9",     "AUD_MCLK",  None,        None },
                { "50"s,  "{}"s, "6000d000.gpio", "11", "17", "UART1_RTS", "UART2_RTS", None,        None },
                { "79"s,  "{}"s, "6000d000.gpio", "12", "18", "I2S0_SCLK", "DAP4_SCLK", None,        None },
                { "14"s,  "{}"s, "6000d000.gpio", "13", "27", "SPI1_SCK",  "SPI2_SCK",  None,        None },
                { "194"s, "{}"s, "6000d000.gpio", "15", "22", "GPIO12",    "LCD_TE",    None,        None },
                { "232"s, "{}"s, "6000d000.gpio", "16", "23", "SPI1_CS1",  "SPI2_CS1",  None,        None },
                { "15"s,  "{}"s, "6000d000.gpio", "18", "24", "SPI1_CS0",  "SPI2_CS0",  None,        None },
                { "16"s,  "{}"s, "6000d000.gpio", "19", "10", "SPI0_MOSI", "SPI1_MOSI", None,        None },
                { "17"s,  "{}"s, "6000d000.gpio", "21", "9",  "SPI0_MISO", "SPI1_MISO", None,        None },
                { "13"s,  "{}"s, "6000d000.gpio", "22", "25", "SPI1_MISO", "SPI2_MISO", None,        None },
                { "18"s,  "{}"s, "6000d000.gpio", "23", "11", "SPI0_SCK",  "SPI1_SCK",  None,        None },
                { "19"s,  "{}"s, "6000d000.gpio", "24", "8",  "SPI0_CS0",  "SPI1_CS0",  None,        None },
                { "20"s,  "{}"s, "6000d000.gpio", "26", "7",  "SPI0_CS1",  "SPI1_CS1",  None,        None },
                { "149"s, "{}"s, "6000d000.gpio", "29", "5",  "GPIO01",    "CAM_AF_EN", None,        None },
                { "200"s, "{}"s, "6000d000.gpio", "31", "6",  "GPIO11",    "GPIO_PZ0",  None,        None },
                // Older versions of L4T have a DT bug which instantiates a bogus device
                // which prevents this library from using this PWM channel.
                { "168"s, "{}"s, "6000d000.gpio", "32", "12", "GPIO07",    "LCD_BL_PW", "7000a000.pwm", 0 },
                { "38"s,  "{}"s, "6000d000.gpio", "33", "13", "GPIO13",    "GPIO_PE6",  "7000a000.pwm", 2 },
                { "76"s,  "{}"s, "6000d000.gpio", "35", "19", "I2S0_FS",   "DAP4_FS",   None,        None },
                { "51"s,  "{}"s, "6000d000.gpio", "36", "16", "UART1_CTS", "UART2_CTS", None,        None },
                { "12"s,  "{}"s, "6000d000.gpio", "37", "26", "SPI1_MOSI", "SPI2_MOSI", None,        None },
                { "77"s,  "{}"s, "6000d000.gpio", "38", "20", "I2S0_DIN",  "DAP4_DIN",  None,        None },
                { "78"s,  "{}"s, "6000d000.gpio", "40", "21", "I2S0_DOUT", "DAP4_DOUT", None,        None }
            };
        }